

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools.c
# Opt level: O2

bool_t UpperPath(tchar_t *Path,tchar_t *Last,size_t LastLen)

{
  int iVar1;
  tchar_t *__s;
  char *pcVar2;
  char *pcVar3;
  bool_t bVar4;
  bool_t HasHost;
  tchar_t Mime [32];
  
  if (*Path == '\0') {
LAB_00122eaf:
    bVar4 = 0;
  }
  else {
    RemovePathDelimiter(Path);
    __s = GetProtocol(Path,Mime,0x20,&HasHost);
    pcVar2 = strrchr(__s,0x5c);
    pcVar3 = strrchr(__s,0x2f);
    if ((pcVar2 < pcVar3 || pcVar2 == (char *)0x0) && (pcVar2 = pcVar3, pcVar3 == (char *)0x0)) {
      iVar1 = tcsicmp(Mime,"smb");
      if (iVar1 == 0) {
        *__s = '\0';
        tcscpy_s(Last,LastLen,Path);
        return 1;
      }
      if ((HasHost != 0) && (iVar1 = tcsicmp(Mime,"upnp"), iVar1 != 0)) goto LAB_00122eaf;
      pcVar2 = __s;
      if (*__s == '\0') {
        __s = Path;
        pcVar2 = Path;
      }
    }
    else {
      pcVar2 = pcVar2 + 1;
    }
    if (Last != (tchar_t *)0x0) {
      tcscpy_s(Last,LastLen,pcVar2);
    }
    if (pcVar2 != __s) goto LAB_00122eda;
    do {
      *pcVar2 = '\0';
LAB_00122eda:
      pcVar2 = pcVar2 + -1;
      bVar4 = 1;
    } while ((__s <= pcVar2) && ((*pcVar2 == '/' || (*pcVar2 == '\\'))));
  }
  return bVar4;
}

Assistant:

bool_t UpperPath(tchar_t* Path, tchar_t* Last, size_t LastLen)
{
    tchar_t *a,*b,*c;
    bool_t HasHost;
    tchar_t Mime[32];

    if (!*Path)
        return 0;

    RemovePathDelimiter(Path);
    c = (tchar_t*)GetProtocol(Path,Mime,TSIZEOF(Mime),&HasHost);

    a = tcsrchr(c,'\\');
    b = tcsrchr(c,'/');
    if (!a || (b && b>a))
        a=b;

    if (!a)
    {
        if (tcsicmp(Mime, T("smb")) == 0) {
            *c = 0;
            tcscpy_s(Last, LastLen, Path);
            return 1;
        }

        if (HasHost && tcsicmp(Mime, T("upnp"))!=0)
            return 0;
        a=c;
        if (!a[0]) // only mime left
            a=c=Path;
    }
    else
        ++a;

    if (Last)
        tcscpy_s(Last,LastLen,a);

    if (a==c)
        *a = 0;

    while (--a>=c && (*a=='\\' || *a=='/'))
        *a = 0;

    return 1;
}